

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall higan::EventLoop::HandleActiveEvent(EventLoop *this)

{
  bool bVar1;
  reference ppCVar2;
  Channel *channel;
  iterator __end1;
  iterator __begin1;
  ChannelList *__range1;
  EventLoop *this_local;
  
  this->handling_pending_event_ = true;
  __end1 = std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::begin
                     (&this->active_channel_list_);
  channel = (Channel *)
            std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::end
                      (&this->active_channel_list_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<higan::Channel_**,_std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>_>
                                *)&channel);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<higan::Channel_**,_std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>_>
              ::operator*(&__end1);
    Channel::HandleEvent(*ppCVar2);
    __gnu_cxx::
    __normal_iterator<higan::Channel_**,_std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>_>
    ::operator++(&__end1);
  }
  this->handling_pending_event_ = false;
  return;
}

Assistant:

void EventLoop::HandleActiveEvent()
{
	handling_pending_event_ = true;
	for (Channel* channel : active_channel_list_)
	{
		channel->HandleEvent();
	}
	handling_pending_event_ = false;
}